

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

int __thiscall QMetaObjectBuilder::indexOfProperty(QMetaObjectBuilder *this,QByteArray *name)

{
  bool bVar1;
  reference lhs;
  reference pvVar2;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QMetaPropertyBuilderPrivate *property;
  vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_> *__range1;
  iterator __end1;
  iterator __begin1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
  *in_stack_ffffffffffffffb0;
  int local_1c;
  __normal_iterator<QMetaPropertyBuilderPrivate_*,_std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_current = (QMetaPropertyBuilderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (QMetaPropertyBuilderPrivate *)
       std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>::begin
                 (in_stack_ffffffffffffffb0);
  std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>::end
            (in_stack_ffffffffffffffb0);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<QMetaPropertyBuilderPrivate_*,_std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<QMetaPropertyBuilderPrivate_*,_std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) {
      local_1c = -1;
LAB_00374b14:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_1c;
      }
      __stack_chk_fail();
    }
    lhs = __gnu_cxx::
          __normal_iterator<QMetaPropertyBuilderPrivate_*,_std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>_>
          ::operator*(&local_10);
    bVar1 = ::operator==(&lhs->name,in_RDI);
    if (bVar1) {
      pvVar2 = std::
               vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>::
               front((vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
                      *)lhs);
      local_1c = (int)(((long)lhs - (long)pvVar2) / 0x48);
      goto LAB_00374b14;
    }
    __gnu_cxx::
    __normal_iterator<QMetaPropertyBuilderPrivate_*,_std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>_>
    ::operator++(&local_10);
  } while( true );
}

Assistant:

int QMetaObjectBuilder::indexOfProperty(const QByteArray &name)
{
    for (const auto &property : d->properties) {
        if (name == property.name)
            return int(&property - &d->properties.front());
    }
    return -1;
}